

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_frommesh.cpp
# Opt level: O3

void __thiscall ON_NgonBoundaryChecker::Internal_Reset(ON_NgonBoundaryChecker *this)

{
  ON_FixedSizePool::ReturnAll(&this->m_fsp);
  memset(this->m_hash_table,0,0x80a);
  return;
}

Assistant:

void ON_NgonBoundaryChecker::Internal_Reset()
{
  m_fsp.ReturnAll();
  for (unsigned i = 0; i < ON_NgonBoundaryChecker::HashTableSize; ++i)
    m_hash_table[i] = nullptr;
  m_vertex_count = 0;
  m_edge_count = 0;
  m_bIsSimple = false;
  m_bIsNotSimple = false;
}